

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::XmlReporter> *this,string *name)

{
  IMutableRegistryHub *pIVar1;
  undefined8 in_RSI;
  shared_ptr<Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory>
  *in_stack_ffffffffffffff98;
  shared_ptr<Catch::IReporterFactory> *this_00;
  shared_ptr<Catch::IReporterFactory> local_30;
  undefined1 local_20 [16];
  undefined8 local_10;
  
  local_10 = in_RSI;
  pIVar1 = getMutableRegistryHub();
  this_00 = &local_30;
  clara::std::make_shared<Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory>();
  std::shared_ptr<Catch::IReporterFactory>::
  shared_ptr<Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory,void>
            (this_00,in_stack_ffffffffffffff98);
  (*pIVar1->_vptr_IMutableRegistryHub[2])(pIVar1,local_10,local_20);
  clara::std::shared_ptr<Catch::IReporterFactory>::~shared_ptr
            ((shared_ptr<Catch::IReporterFactory> *)0x16c129);
  clara::std::shared_ptr<Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory>::~shared_ptr
            ((shared_ptr<Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory> *)0x16c133);
  return;
}

Assistant:

explicit ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, std::make_shared<ReporterFactory>() );
        }